

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O0

void __kmpc_omp_task_begin_if0_template<false>
               (ident_t *loc_ref,kmp_int32 gtid,kmp_task_t *task,void *frame_address,
               void *return_address)

{
  kmp_taskdata_t *current_task_00;
  int *piVar1;
  kmp_task_t *in_RDX;
  int in_ESI;
  kmp_int32 counter;
  kmp_taskdata_t *current_task;
  kmp_taskdata_t *taskdata;
  
  current_task_00 = (__kmp_threads[in_ESI]->th).th_current_task;
  if (((ulong)in_RDX[-8].shareds & 0x100000000) == 0) {
    piVar1 = (int *)((long)&in_RDX[-8].data2 + 4);
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  *(uint *)((long)&in_RDX[-8].shareds + 4) =
       *(uint *)((long)&in_RDX[-8].shareds + 4) & 0xfffdffff | 0x20000;
  __kmp_task_start(in_ESI,in_RDX,current_task_00);
  return;
}

Assistant:

static void __kmpc_omp_task_begin_if0_template(ident_t *loc_ref, kmp_int32 gtid,
                                               kmp_task_t *task,
                                               void *frame_address,
                                               void *return_address) {
  kmp_taskdata_t *taskdata = KMP_TASK_TO_TASKDATA(task);
  kmp_taskdata_t *current_task = __kmp_threads[gtid]->th.th_current_task;

  KA_TRACE(10, ("__kmpc_omp_task_begin_if0(enter): T#%d loc=%p task=%p "
                "current_task=%p\n",
                gtid, loc_ref, taskdata, current_task));

  if (taskdata->td_flags.tiedness == TASK_UNTIED) {
    // untied task needs to increment counter so that the task structure is not
    // freed prematurely
    kmp_int32 counter = 1 + KMP_ATOMIC_INC(&taskdata->td_untied_count);
    KMP_DEBUG_USE_VAR(counter);
    KA_TRACE(20, ("__kmpc_omp_task_begin_if0: T#%d untied_count (%d) "
                  "incremented for task %p\n",
                  gtid, counter, taskdata));
  }

  taskdata->td_flags.task_serial =
      1; // Execute this task immediately, not deferred.
  __kmp_task_start(gtid, task, current_task);

#if OMPT_SUPPORT
  if (ompt) {
    if (current_task->ompt_task_info.frame.enter_frame.ptr == NULL) {
      current_task->ompt_task_info.frame.enter_frame.ptr =
          taskdata->ompt_task_info.frame.exit_frame.ptr = frame_address;
      current_task->ompt_task_info.frame.enter_frame_flags =
          taskdata->ompt_task_info.frame.exit_frame_flags = ompt_frame_application | OMPT_FRAME_POSITION_DEFAULT;
    }
    if (ompt_enabled.ompt_callback_task_create) {
      ompt_task_info_t *parent_info = &(current_task->ompt_task_info);
      ompt_callbacks.ompt_callback(ompt_callback_task_create)(
          &(parent_info->task_data), &(parent_info->frame),
          &(taskdata->ompt_task_info.task_data),
          ompt_task_explicit | TASK_TYPE_DETAILS_FORMAT(taskdata), 0,
          return_address);
    }
    __ompt_task_start(task, current_task, gtid);
  }
#endif // OMPT_SUPPORT

  KA_TRACE(10, ("__kmpc_omp_task_begin_if0(exit): T#%d loc=%p task=%p,\n", gtid,
                loc_ref, taskdata));
}